

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  int iVar1;
  bool bVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  byte *pbVar4;
  ulong uVar5;
  char buffer [66];
  undefined8 uStack_60;
  char acStack_58 [80];
  
  bVar3 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  iVar1 = *(int *)(this + 8);
  pbVar4 = (byte *)(acStack_58 + (long)iVar1 + -1);
  uVar5 = *(ulong *)this;
  do {
    *pbVar4 = (byte)uVar5 & 1 | 0x30;
    pbVar4 = pbVar4 + -1;
    bVar2 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar2);
  uStack_60 = 0x18a472;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (acStack_58,acStack_58 + iVar1,bVar3);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }